

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::CriticalSectionSubSysInitialize(void)

{
  bool bVar1;
  CSSubSysInitState *pCVar2;
  CSSubSysInitState local_10;
  LONG local_c;
  LONG lRet;
  
  pCVar2 = Volatile<CorUnix::CSSubSysInitState>::operator&
                     ((Volatile<CorUnix::CSSubSysInitState> *)&csssInitState);
  local_c = InterlockedCompareExchange((LONG *)pCVar2,1,0);
  if (local_c == 0) {
    PTR_g_PALCSList_00480798 = (undefined *)&g_PALCSList;
    g_PALCSList = (undefined *)&g_PALCSList;
    InternalInitializeCriticalSectionAndSpinCount((PCRITICAL_SECTION)g_csPALCSsListLock,0,true);
    pCVar2 = Volatile<CorUnix::CSSubSysInitState>::operator&
                       ((Volatile<CorUnix::CSSubSysInitState> *)&csssInitState);
    InterlockedExchange((LONG *)pCVar2,2);
  }
  else {
    while( true ) {
      local_10 = CSSubSysInitialized;
      bVar1 = Volatile<CorUnix::CSSubSysInitState>::operator!=
                        ((Volatile<CorUnix::CSSubSysInitState> *)&csssInitState,&local_10);
      if (!bVar1) break;
      sched_yield();
    }
  }
  return;
}

Assistant:

void CriticalSectionSubSysInitialize()
    {
        static_assert(sizeof(CRITICAL_SECTION) >= sizeof(PAL_CRITICAL_SECTION),
            "PAL fatal internal error: sizeof(CRITICAL_SECTION) is "
            "smaller than sizeof(PAL_CRITICAL_SECTION)");

#ifdef _DEBUG
        LONG lRet = InterlockedCompareExchange((LONG *)&csssInitState,
                                               (LONG)CSSubSysInitializing,
                                               (LONG)CSSubSysNotInitialzed);
        if ((LONG)CSSubSysNotInitialzed == lRet)
        {
            InitializeListHead(&g_PALCSList);

            InternalInitializeCriticalSectionAndSpinCount(
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock),
                0, true);
            InterlockedExchange((LONG *)&csssInitState,
                                (LONG)CSSubSysInitialized);
        }
        else
        {
            while (csssInitState != CSSubSysInitialized)
            {
                sched_yield();
            }
        }
#endif // _DEBUG
    }